

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O0

EDLines * __thiscall EDLines::getLineImage(EDLines *this)

{
  int iVar1;
  int iVar2;
  int *in_RSI;
  Scalar_<double> local_a0;
  Point_ local_7c [8];
  Point_ local_74 [20];
  _InputOutputArray local_60;
  int local_44;
  undefined1 local_40 [4];
  int i;
  undefined1 local_19;
  EDLines *this_local;
  Mat *lineImage;
  
  local_19 = 0;
  iVar1 = in_RSI[1];
  iVar2 = *in_RSI;
  this_local = this;
  cv::Scalar_<double>::Scalar_((Scalar_<double> *)local_40,255.0);
  cv::Mat::Mat((Mat *)this,iVar1,iVar2,0,(Scalar_ *)local_40);
  for (local_44 = 0; local_44 < in_RSI[0x9c]; local_44 = local_44 + 1) {
    cv::_InputOutputArray::_InputOutputArray(&local_60,(Mat *)this);
    std::vector<LS,_std::allocator<LS>_>::operator[]
              ((vector<LS,_std::allocator<LS>_> *)(in_RSI + 0x96),(long)local_44);
    cv::Point_::operator_cast_to_Point_(local_74);
    std::vector<LS,_std::allocator<LS>_>::operator[]
              ((vector<LS,_std::allocator<LS>_> *)(in_RSI + 0x96),(long)local_44);
    cv::Point_::operator_cast_to_Point_(local_7c);
    cv::Scalar_<double>::Scalar_(&local_a0,0.0);
    cv::line(&local_60,local_74,local_7c,&local_a0,1,0x10,0);
    cv::_InputOutputArray::~_InputOutputArray(&local_60);
  }
  return this;
}

Assistant:

Mat EDLines::getLineImage()
{
	Mat lineImage = Mat(height, width, CV_8UC1, Scalar(255));
	for (int i = 0; i < linesNo; i++) {
		line(lineImage, linePoints[i].start, linePoints[i].end, Scalar(0), 1, LINE_AA, 0);
	}

	return lineImage;
}